

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O1

DdNode * Extra_bddSpaceFromFunctionPos(DdManager *dd,DdNode *bFunc)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraBddSpaceFromFunctionPos(dd,bFunc);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_bddSpaceFromFunctionPos( DdManager * dd, DdNode * bFunc )
{
    DdNode * bRes;
    do {
        dd->reordered = 0;
        bRes = extraBddSpaceFromFunctionPos( dd, bFunc );
    } while (dd->reordered == 1);
    return bRes;
}